

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O0

int XLearnSetPreModel(XL *out,char *pre_model_path)

{
  HyperParam *pHVar1;
  char *in_RSI;
  undefined8 *in_RDI;
  runtime_error *_except_;
  XLearn *xl;
  allocator local_41;
  string local_40 [32];
  XLearn *local_20;
  
  local_20 = (XLearn *)*in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,in_RSI,&local_41);
  pHVar1 = XLearn::GetHyperParam(local_20);
  std::__cxx11::string::operator=((string *)&pHVar1->pre_model_file,local_40);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return 0;
}

Assistant:

XL_DLL int XLearnSetPreModel(XL *out, const char *pre_model_path) {
  API_BEGIN();
  XLearn* xl = reinterpret_cast<XLearn*>(*out);
  xl->GetHyperParam().pre_model_file = std::string(pre_model_path);
  API_END();
}